

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O1

bool __thiscall axl::io::Ssl::doHandshake(Ssl *this)

{
  int retCode;
  
  retCode = SSL_do_handshake((SSL *)(this->
                                    super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>
                                    ).m_h);
  if (retCode < 1) {
    setError(this,retCode);
  }
  return 0 < retCode;
}

Assistant:

bool
Ssl::doHandshake() {
	ASSERT(m_h);

	int result = ::SSL_do_handshake(m_h);
	if (result <= 0) {
		setError(result);
		return false;
	}

	return true;
}